

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O0

void __thiscall
booster::aio::anon_unknown_3::async_acceptor::operator()(async_acceptor *this,error_code *e)

{
  bool bVar1;
  socklen_t *in_RCX;
  error_code *in_RSI;
  error_code *in_RDI;
  callback<void_(const_std::error_code_&)> *unaff_retaddr;
  error_code reserr;
  stream_socket *in_stack_00000028;
  acceptor *in_stack_00000030;
  error_code *in_stack_ffffffffffffffe0;
  error_code *args;
  
  args = in_RDI;
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    callback<void_(const_std::error_code_&)>::operator()(unaff_retaddr,args);
  }
  else {
    std::error_code::error_code(in_stack_ffffffffffffffe0);
    acceptor::accept(*(acceptor **)(in_RDI + 2),(int)in_RDI[1]._M_cat,
                     (sockaddr *)&stack0xffffffffffffffe0,in_RCX);
    bVar1 = basic_io_device::would_block(in_stack_ffffffffffffffe0);
    if (bVar1) {
      acceptor::async_accept(in_stack_00000030,in_stack_00000028,(event_handler *)this);
    }
    else {
      callback<void_(const_std::error_code_&)>::operator()(unaff_retaddr,args);
    }
  }
  return;
}

Assistant:

void operator()(system::error_code const &e)
		{
			if(e) { h(e); return; }
			system::error_code reserr;
			source->accept(*target,reserr);
			if(basic_io_device::would_block(reserr)) {
				source->async_accept(*target,h);
			}
			else
				h(reserr);
		}